

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

void __thiscall Mat::Mat(Mat *this,int m,int n,double *a)

{
  double dVar1;
  undefined1 auVar2 [16];
  double *pdVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  this->n_rows_ = m;
  this->n_cols_ = n;
  uVar5 = n * m;
  if ((int)uVar5 < 1) {
    this->v_ = (double *)0x0;
  }
  else {
    pdVar3 = (double *)operator_new__((ulong)uVar5 * 8);
    this->v_ = pdVar3;
    auVar2 = _DAT_00109140;
    dVar1 = *a;
    lVar6 = (ulong)uVar5 - 1;
    auVar7._8_4_ = (int)lVar6;
    auVar7._0_8_ = lVar6;
    auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
    uVar4 = 0;
    auVar7 = auVar7 ^ _DAT_00109140;
    auVar8 = _DAT_00109130;
    do {
      auVar9 = auVar8 ^ auVar2;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        pdVar3[uVar4] = dVar1;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        pdVar3[uVar4 + 1] = dVar1;
      }
      uVar4 = uVar4 + 2;
      lVar6 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar6 + 2;
    } while ((uVar5 + 1 & 0xfffffffe) != uVar4);
  }
  return;
}

Assistant:

Mat::Mat(int m, int n, const double& a) : n_rows_(m), n_cols_(n),v_(m*n>0 ? new double[m*n] : NULL)
{
	for(int i=0; i<m*n; i++) v_[i] = a;
}